

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreeTypeFaceWrapper.cpp
# Opt level: O0

bool __thiscall
FreeTypeFaceWrapper::IsDefiningCharsNotInAdobeStandardLatin(FreeTypeFaceWrapper *this)

{
  FT_UInt local_2c;
  FT_ULong FStack_28;
  FT_UInt glyphIndex;
  FT_ULong characterCode;
  FreeTypeFaceWrapper *pFStack_18;
  bool hasOnlyAdobeStandard;
  FreeTypeFaceWrapper *this_local;
  
  if (this->mFace == (FT_Face)0x0) {
    this_local._7_1_ = false;
  }
  else {
    characterCode._7_1_ = 1;
    pFStack_18 = this;
    FStack_28 = FT_Get_First_Char(this->mFace,&local_2c);
    characterCode._7_1_ = IsCharachterCodeAdobeStandard(this,FStack_28);
    while ((bool)characterCode._7_1_ != false && local_2c != 0) {
      FStack_28 = FT_Get_Next_Char(this->mFace,FStack_28,&local_2c);
      characterCode._7_1_ = IsCharachterCodeAdobeStandard(this,FStack_28);
    }
    this_local._7_1_ = (bool)((characterCode._7_1_ ^ 0xff) & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool FreeTypeFaceWrapper::IsDefiningCharsNotInAdobeStandardLatin()
{
	if(mFace)
	{
		// loop charachters in font, till you find a non Adobe Standard Latin. hmm. seems like this method marks all as symbol...
		// need to think about this...
		bool hasOnlyAdobeStandard = true;
		FT_ULong characterCode;
		FT_UInt glyphIndex;
		
		characterCode = FT_Get_First_Char(mFace,&glyphIndex);
		hasOnlyAdobeStandard = IsCharachterCodeAdobeStandard(characterCode);
		while(hasOnlyAdobeStandard && glyphIndex != 0)
		{
			characterCode = FT_Get_Next_Char(mFace, characterCode, &glyphIndex);
			hasOnlyAdobeStandard = IsCharachterCodeAdobeStandard(characterCode);
		}
		return !hasOnlyAdobeStandard;
	}
	else
		return false;
}